

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers_p.h
# Opt level: O3

void QtPromisePrivate::connectDestroyedToReject<void,Object>
               (QPromiseConnections *connections,QPromiseReject<void> *reject,Object *sender)

{
  element_type *this;
  Connection local_40;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  Data *local_28;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  Data *local_10;
  
  local_38 = (connections->m_d).
             super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  local_30 = (connections->m_d).
             super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  local_28 = (reject->m_resolver).m_d.d;
  if (local_28 != (Data *)0x0) {
    LOCK();
    (local_28->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(local_28->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  if (local_28 != (Data *)0x0) {
    LOCK();
    (local_28->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(local_28->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_20 = local_38;
  local_18 = local_30;
  local_10 = local_28;
  QObject::
  connect<void(QObject::*)(QObject*),QtPromisePrivate::connectDestroyedToReject<void,Object>(QtPromise::QPromiseConnections_const&,QtPromise::QPromiseReject<void>const&,Object_const*)::_lambda()_1_>
            ((Object *)&local_40,(offset_in_QObject_to_subr)sender,(QObject *)QObject::destroyed,
             (anon_class_24_2_90de82aa_for_function *)0x0,(ConnectionType)sender);
  if (local_10 != (Data *)0x0) {
    LOCK();
    (local_10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_10,0x10);
    }
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  this = (connections->m_d).
         super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
            ((QGenericArrayOps<QMetaObject::Connection> *)this,(this->connections).d.size,&local_40)
  ;
  QMetaObject::Connection::~Connection(&local_40);
  if (local_28 != (Data *)0x0) {
    LOCK();
    (local_28->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_28->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_28,0x10);
    }
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

void connectDestroyedToReject(const QtPromise::QPromiseConnections& connections,
                              const QtPromise::QPromiseReject<T>& reject,
                              const Sender* sender)
{
    connections << QObject::connect(sender, &QObject::destroyed, [=]() {
        connections.disconnect();
        reject(QtPromise::QPromiseContextException{});
    });
}